

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_dm.cxx
# Opt level: O1

void __thiscall xray_re::xr_dm::save_dm(xr_dm *this,xr_writer *w)

{
  undefined1 local_24 [4];
  
  xr_writer::w_sz(w,&this->m_shader);
  xr_writer::w_sz(w,&this->m_texture);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  xr_vbuf::save_dm(&this->m_vb,w);
  xr_ibuf::save(&this->m_ib,w);
  return;
}

Assistant:

void xr_dm::save_dm(xr_writer& w) const
{
	w.w_sz(m_shader);
	w.w_sz(m_texture);
	w.w_u32(m_flags);
	w.w_float(m_min_scale);
	w.w_float(m_max_scale);
	w.w_size_u32(m_vb.size());
	w.w_size_u32(m_ib.size());
	m_vb.save_dm(w);
	m_ib.save(w);
}